

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O2

void __thiscall pg::RTLSolver::~RTLSolver(RTLSolver *this)

{
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__RTLSolver_001a9b08;
  uintqueue::~uintqueue(&this->Q);
  bitset::~bitset(&this->W);
  bitset::~bitset(&this->V);
  bitset::~bitset(&this->S);
  bitset::~bitset(&this->G);
  bitset::~bitset(&this->Z);
  bitset::~bitset(&this->R);
  bitset::~bitset(&this->escapes);
  uintqueue::~uintqueue(&this->tangleto);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->tangle).super__Vector_base<int,_std::allocator<int>_>);
  bitset::~bitset(&this->pea_root);
  uintqueue::~uintqueue(&this->pea_S);
  uintqueue::~uintqueue(&this->pea_state);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->tpr).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int_*,_std::allocator<int_*>_>::~_Vector_base
            (&(this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>);
  std::_Vector_base<int_*,_std::allocator<int_*>_>::~_Vector_base
            (&(this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>);
  return;
}

Assistant:

RTLSolver::~RTLSolver()
{
}